

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  int iVar6;
  ImU32 IVar7;
  uint uVar8;
  GetterXsYRef<unsigned_long_long> *pGVar9;
  TransformerLogLin *pTVar10;
  ImPlotPlot *pIVar11;
  ImDrawVert *pIVar12;
  ImDrawIdx *pIVar13;
  ImPlotContext *pIVar14;
  ImPlotContext *pIVar15;
  ImDrawIdx IVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  double dVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  pIVar14 = GImPlot;
  pGVar9 = this->Getter1;
  pTVar10 = this->Transformer;
  iVar6 = pGVar9->Count;
  uVar2 = *(unsigned_long_long *)
           ((long)pGVar9->Xs +
           (long)(((pGVar9->Offset + prim) % iVar6 + iVar6) % iVar6) * (long)pGVar9->Stride);
  dVar3 = pGVar9->YRef;
  dVar22 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar15 = GImPlot;
  pIVar11 = pIVar14->CurrentPlot;
  dVar4 = (pIVar11->XAxis).Range.Min;
  iVar6 = pTVar10->YAxis;
  fVar18 = (float)((((double)(float)(dVar22 / pIVar14->LogDenX) *
                     ((pIVar11->XAxis).Range.Max - dVar4) + dVar4) - dVar4) * pIVar14->Mx +
                  (double)pIVar14->PixelRange[iVar6].Min.x);
  fVar19 = (float)((dVar3 - pIVar11->YAxis[iVar6].Range.Min) * pIVar14->My[iVar6] +
                  (double)pIVar14->PixelRange[iVar6].Min.y);
  pGVar9 = this->Getter2;
  pTVar10 = this->Transformer;
  iVar6 = pGVar9->Count;
  uVar2 = *(unsigned_long_long *)
           ((long)pGVar9->Xs +
           (long)(((prim + pGVar9->Offset) % iVar6 + iVar6) % iVar6) * (long)pGVar9->Stride);
  dVar3 = pGVar9->YRef;
  dVar22 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar11 = pIVar15->CurrentPlot;
  dVar4 = (pIVar11->XAxis).Range.Min;
  iVar6 = pTVar10->YAxis;
  fVar23 = (float)((((double)(float)(dVar22 / pIVar15->LogDenX) *
                     ((pIVar11->XAxis).Range.Max - dVar4) + dVar4) - dVar4) * pIVar15->Mx +
                  (double)pIVar15->PixelRange[iVar6].Min.x);
  fVar24 = (float)((dVar3 - pIVar11->YAxis[iVar6].Range.Min) * pIVar15->My[iVar6] +
                  (double)pIVar15->PixelRange[iVar6].Min.y);
  fVar20 = fVar19;
  if (fVar24 <= fVar19) {
    fVar20 = fVar24;
  }
  bVar17 = false;
  if ((fVar20 < (cull_rect->Max).y) &&
     (fVar20 = (float)(~-(uint)(fVar24 <= fVar19) & (uint)fVar24 |
                      -(uint)(fVar24 <= fVar19) & (uint)fVar19), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar20 && fVar20 != *pfVar1)) {
    fVar20 = fVar18;
    if (fVar23 <= fVar18) {
      fVar20 = fVar23;
    }
    bVar17 = false;
    if (fVar20 < (cull_rect->Max).x) {
      fVar20 = (float)(~-(uint)(fVar23 <= fVar18) & (uint)fVar23 |
                      -(uint)(fVar23 <= fVar18) & (uint)fVar18);
      bVar17 = (cull_rect->Min).x <= fVar20 && fVar20 != (cull_rect->Min).x;
    }
  }
  if (bVar17 != false) {
    fVar20 = this->Weight;
    IVar7 = this->Col;
    IVar5 = *uv;
    fVar25 = fVar23 - fVar18;
    fVar26 = fVar24 - fVar19;
    fVar21 = fVar25 * fVar25 + fVar26 * fVar26;
    if (0.0 < fVar21) {
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        fVar21 = SQRT(fVar21);
      }
      fVar25 = fVar25 * (1.0 / fVar21);
      fVar26 = fVar26 * (1.0 / fVar21);
    }
    fVar20 = fVar20 * 0.5;
    fVar25 = fVar25 * fVar20;
    fVar20 = fVar20 * fVar26;
    pIVar12 = DrawList->_VtxWritePtr;
    (pIVar12->pos).x = fVar20 + fVar18;
    (pIVar12->pos).y = fVar19 - fVar25;
    pIVar12->uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar7;
    pIVar12[1].pos.x = fVar20 + fVar23;
    pIVar12[1].pos.y = fVar24 - fVar25;
    pIVar12[1].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar7;
    pIVar12[2].pos.x = fVar23 - fVar20;
    pIVar12[2].pos.y = fVar25 + fVar24;
    pIVar12[2].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar7;
    pIVar12[3].pos.x = fVar18 - fVar20;
    pIVar12[3].pos.y = fVar25 + fVar19;
    pIVar12[3].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar8 = DrawList->_VtxCurrentIdx;
    pIVar13 = DrawList->_IdxWritePtr;
    IVar16 = (ImDrawIdx)uVar8;
    *pIVar13 = IVar16;
    pIVar13[1] = IVar16 + 1;
    pIVar13[2] = IVar16 + 2;
    pIVar13[3] = IVar16;
    pIVar13[4] = IVar16 + 2;
    pIVar13[5] = IVar16 + 3;
    DrawList->_IdxWritePtr = pIVar13 + 6;
    DrawList->_VtxCurrentIdx = uVar8 + 4;
  }
  return bVar17;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }